

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O0

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab,float X,float Y,float Z,uint32_t *r,uint32_t *g,
                 uint32_t *b)

{
  float *pfVar1;
  float fVar2;
  uint32_t local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  int local_8c;
  int local_7c;
  int local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float *matrix;
  float Yb;
  float Yg;
  float Yr;
  int i;
  uint32_t *b_local;
  uint32_t *g_local;
  uint32_t *r_local;
  float Z_local;
  float Y_local;
  float X_local;
  TIFFCIELabToRGB *cielab_local;
  
  local_54 = (cielab->display).d_mat[0][2] * Z +
             (cielab->display).d_mat[0][0] * X + (cielab->display).d_mat[0][1] * Y;
  local_58 = (cielab->display).d_mat[1][2] * Z +
             (cielab->display).d_mat[1][0] * X + (cielab->display).d_mat[1][1] * Y;
  local_5c = (cielab->display).d_mat[2][2] * Z +
             (cielab->display).d_mat[2][0] * X + (cielab->display).d_mat[2][1] * Y;
  pfVar1 = &(cielab->display).d_Y0R;
  if (local_54 < *pfVar1 || local_54 == *pfVar1) {
    local_54 = (cielab->display).d_Y0R;
  }
  pfVar1 = &(cielab->display).d_Y0G;
  if (local_58 < *pfVar1 || local_58 == *pfVar1) {
    local_58 = (cielab->display).d_Y0G;
  }
  pfVar1 = &(cielab->display).d_Y0B;
  if (local_5c < *pfVar1 || local_5c == *pfVar1) {
    local_5c = (cielab->display).d_Y0B;
  }
  if ((cielab->display).d_YCR <= local_54) {
    local_60 = (cielab->display).d_YCR;
  }
  else {
    local_60 = local_54;
  }
  if ((cielab->display).d_YCG <= local_58) {
    local_64 = (cielab->display).d_YCG;
  }
  else {
    local_64 = local_58;
  }
  if ((cielab->display).d_YCB <= local_5c) {
    local_68 = (cielab->display).d_YCB;
  }
  else {
    local_68 = local_5c;
  }
  local_6c = (int)((local_60 - (cielab->display).d_Y0R) / cielab->rstep);
  if (cielab->range < local_6c) {
    local_6c = cielab->range;
  }
  if (cielab->Yr2r[local_6c] <= 0.0) {
    fVar2 = cielab->Yr2r[local_6c] - 0.5;
  }
  else {
    fVar2 = cielab->Yr2r[local_6c] + 0.5;
  }
  *r = (uint32_t)(long)fVar2;
  local_7c = (int)((local_64 - (cielab->display).d_Y0G) / cielab->gstep);
  if (cielab->range < local_7c) {
    local_7c = cielab->range;
  }
  if (cielab->Yg2g[local_7c] <= 0.0) {
    fVar2 = cielab->Yg2g[local_7c] - 0.5;
  }
  else {
    fVar2 = cielab->Yg2g[local_7c] + 0.5;
  }
  *g = (uint32_t)(long)fVar2;
  local_8c = (int)((local_68 - (cielab->display).d_Y0B) / cielab->bstep);
  if (cielab->range < local_8c) {
    local_8c = cielab->range;
  }
  if (cielab->Yb2b[local_8c] <= 0.0) {
    fVar2 = cielab->Yb2b[local_8c] - 0.5;
  }
  else {
    fVar2 = cielab->Yb2b[local_8c] + 0.5;
  }
  *b = (uint32_t)(long)fVar2;
  if (*r < (cielab->display).d_Vrwr) {
    local_9c = *r;
  }
  else {
    local_9c = (cielab->display).d_Vrwr;
  }
  *r = local_9c;
  if (*g < (cielab->display).d_Vrwg) {
    local_a0 = *g;
  }
  else {
    local_a0 = (cielab->display).d_Vrwg;
  }
  *g = local_a0;
  if (*b < (cielab->display).d_Vrwb) {
    local_a4 = *b;
  }
  else {
    local_a4 = (cielab->display).d_Vrwb;
  }
  *b = local_a4;
  return;
}

Assistant:

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab, float X, float Y, float Z,
                  uint32_t *r, uint32_t *g, uint32_t *b)
{
    int i;
    float Yr, Yg, Yb;
    float *matrix = &cielab->display.d_mat[0][0];

    /* Multiply through the matrix to get luminosity values. */
    Yr = matrix[0] * X + matrix[1] * Y + matrix[2] * Z;
    Yg = matrix[3] * X + matrix[4] * Y + matrix[5] * Z;
    Yb = matrix[6] * X + matrix[7] * Y + matrix[8] * Z;

    /* Clip input */
    Yr = TIFFmax(Yr, cielab->display.d_Y0R);
    Yg = TIFFmax(Yg, cielab->display.d_Y0G);
    Yb = TIFFmax(Yb, cielab->display.d_Y0B);

    /* Avoid overflow in case of wrong input values */
    Yr = TIFFmin(Yr, cielab->display.d_YCR);
    Yg = TIFFmin(Yg, cielab->display.d_YCG);
    Yb = TIFFmin(Yb, cielab->display.d_YCB);

    /* Turn luminosity to colour value. */
    i = (int)((Yr - cielab->display.d_Y0R) / cielab->rstep);
    i = TIFFmin(cielab->range, i);
    *r = RINT(cielab->Yr2r[i]);

    i = (int)((Yg - cielab->display.d_Y0G) / cielab->gstep);
    i = TIFFmin(cielab->range, i);
    *g = RINT(cielab->Yg2g[i]);

    i = (int)((Yb - cielab->display.d_Y0B) / cielab->bstep);
    i = TIFFmin(cielab->range, i);
    *b = RINT(cielab->Yb2b[i]);

    /* Clip output. */
    *r = TIFFmin(*r, cielab->display.d_Vrwr);
    *g = TIFFmin(*g, cielab->display.d_Vrwg);
    *b = TIFFmin(*b, cielab->display.d_Vrwb);
}